

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_debug.cpp
# Opt level: O0

FString __thiscall FGLDebug::TypeToString(FGLDebug *this,GLenum type)

{
  GLenum type_local;
  FString *s;
  
  FString::FString((FString *)this);
  switch(type) {
  case 0x824c:
    FString::operator=((FString *)this,"error");
    break;
  case 0x824d:
    FString::operator=((FString *)this,"deprecated");
    break;
  case 0x824e:
    FString::operator=((FString *)this,"undefined");
    break;
  case 0x824f:
    FString::operator=((FString *)this,"portability");
    break;
  case 0x8250:
    FString::operator=((FString *)this,"performance");
    break;
  case 0x8251:
    FString::operator=((FString *)this,"other");
    break;
  default:
    FString::Format((FString *)this,"%d",(ulong)type);
    break;
  case 0x8268:
    FString::operator=((FString *)this,"marker");
    break;
  case 0x8269:
    FString::operator=((FString *)this,"push group");
    break;
  case 0x826a:
    FString::operator=((FString *)this,"pop group");
  }
  return (FString)(char *)this;
}

Assistant:

FString FGLDebug::TypeToString(GLenum type)
{
	FString s;
	switch (type)
	{
	case GL_DEBUG_TYPE_ERROR: s = "error"; break;
	case GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR: s = "deprecated"; break;
	case GL_DEBUG_TYPE_UNDEFINED_BEHAVIOR: s = "undefined"; break;
	case GL_DEBUG_TYPE_PORTABILITY: s = "portability"; break;
	case GL_DEBUG_TYPE_PERFORMANCE: s = "performance"; break;
	case GL_DEBUG_TYPE_MARKER: s = "marker"; break;
	case GL_DEBUG_TYPE_PUSH_GROUP: s = "push group"; break;
	case GL_DEBUG_TYPE_POP_GROUP: s = "pop group"; break;
	case GL_DEBUG_TYPE_OTHER: s = "other"; break;
	default: s.Format("%d", (int)type);
	}
	return s;
}